

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O3

void __thiscall
Js::JavascriptProxy::ExtractSnapObjectDataInto
          (JavascriptProxy *this,SnapObject *objData,SlabAllocator *alloc)

{
  RecyclableObject *pRVar1;
  bool bVar2;
  bool bVar3;
  SnapProxyInfo *addtlInfo;
  TTD_PTR_ID *dependsOnArray;
  uint dependsOnArrayCount;
  long lVar4;
  
  addtlInfo = (SnapProxyInfo *)TTD::SlabAllocatorBase<0>::SlabAllocateTypeRawSize<16ul>(alloc);
  dependsOnArray =
       (TTD_PTR_ID *)TTD::SlabAllocatorBase<0>::SlabAllocateRawSize<true,false>(alloc,0x10);
  addtlInfo->HandlerId = 0;
  pRVar1 = (this->handler).ptr;
  lVar4 = 0;
  bVar2 = true;
  if (pRVar1 != (RecyclableObject *)0x0) {
    addtlInfo->HandlerId = (TTD_PTR_ID)pRVar1;
    bVar3 = TTD::JsSupport::IsVarComplexKind(pRVar1);
    if (bVar3) {
      *dependsOnArray = (TTD_PTR_ID)(this->handler).ptr;
      lVar4 = 1;
      bVar2 = false;
    }
  }
  addtlInfo->TargetId = 0;
  pRVar1 = (this->target).ptr;
  if (pRVar1 != (RecyclableObject *)0x0) {
    addtlInfo->TargetId = (TTD_PTR_ID)pRVar1;
    bVar3 = TTD::JsSupport::IsVarComplexKind((this->handler).ptr);
    if (bVar3) {
      dependsOnArray[lVar4] = (TTD_PTR_ID)(this->target).ptr;
      dependsOnArrayCount = (int)lVar4 + 1;
      goto LAB_00cfe920;
    }
  }
  dependsOnArrayCount = 1;
  if (bVar2) {
    TTD::SlabAllocatorBase<0>::SlabAbortArraySpace<unsigned_long>(alloc,2);
    if (objData->SnapObjectTag == SnapProxyObject) {
      objData->AddtlSnapObjectInfo = addtlInfo;
      return;
    }
    TTDAbort_unrecoverable_error("Tag does not match.");
  }
LAB_00cfe920:
  TTD::SlabAllocatorBase<0>::SlabCommitArraySpace<unsigned_long>(alloc,(ulong)dependsOnArrayCount,2)
  ;
  TTD::NSSnapObjects::
  StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapProxyInfo*,(TTD::NSSnapObjects::SnapObjectType)27>
            (objData,addtlInfo,alloc,dependsOnArrayCount,dependsOnArray);
  return;
}

Assistant:

void JavascriptProxy::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        TTD::NSSnapObjects::SnapProxyInfo* spi = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapProxyInfo>();

        const uint32 reserveSize = 2;
        uint32 depOnCount = 0;
        TTD_PTR_ID* depOnArray = alloc.SlabReserveArraySpace<TTD_PTR_ID>(reserveSize);

        spi->HandlerId = TTD_INVALID_PTR_ID;
        if(this->handler != nullptr)
        {
            spi->HandlerId = TTD_CONVERT_VAR_TO_PTR_ID(this->handler);

            if(TTD::JsSupport::IsVarComplexKind(this->handler))
            {
                depOnArray[depOnCount] = TTD_CONVERT_VAR_TO_PTR_ID(this->handler);
                depOnCount++;
            }
        }

        spi->TargetId = TTD_INVALID_PTR_ID;
        if(this->target != nullptr)
        {
            spi->TargetId = TTD_CONVERT_VAR_TO_PTR_ID(this->target);

            if(TTD::JsSupport::IsVarComplexKind(this->handler))
            {
                depOnArray[depOnCount] = TTD_CONVERT_VAR_TO_PTR_ID(this->target);
                depOnCount++;
            }
        }

        if(depOnCount == 0)
        {
            alloc.SlabAbortArraySpace<TTD_PTR_ID>(reserveSize);

            TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapProxyInfo*, TTD::NSSnapObjects::SnapObjectType::SnapProxyObject>(objData, spi);
        }
        else
        {
            alloc.SlabCommitArraySpace<TTD_PTR_ID>(depOnCount, reserveSize);

            TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapProxyInfo*, TTD::NSSnapObjects::SnapObjectType::SnapProxyObject>(objData, spi, alloc, depOnCount, depOnArray);
        }
    }